

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O0

void __thiscall osMutex::osMutex(osMutex *this,char *name)

{
  int local_20;
  pthread_mutexattr_t local_1c;
  int i;
  pthread_mutexattr_t attr;
  char *name_local;
  osMutex *this_local;
  
  this->Name = name;
  this->OwnerFile = (char *)0x0;
  this->OwnerThread = (osThread *)0x0;
  _i = name;
  name_local = (char *)this;
  pthread_mutexattr_init(&local_1c);
  pthread_mutexattr_settype(&local_1c,1);
  pthread_mutex_init((pthread_mutex_t *)this,&local_1c);
  StaticInit();
  LockListMutex();
  local_20 = 0;
  do {
    if (0xf < local_20) {
LAB_0010d7bf:
      UnlockListMutex();
      return;
    }
    if (MutexList[local_20] == (osMutex *)0x0) {
      MutexList[local_20] = this;
      goto LAB_0010d7bf;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

osMutex::osMutex(const char* name)
    : Name(name)
    , OwnerFile(nullptr)
    , OwnerThread(nullptr)
{
#ifdef _WIN32
    Handle = CreateMutex(nullptr, false, name);
#elif __linux__
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&m_mutex, &attr);
#endif

    StaticInit();
    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        if (MutexList[i] == nullptr)
        {
            MutexList[i] = this;
            break;
        }
    }
    UnlockListMutex();
}